

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

void __thiscall features::Surf::set_image(Surf *this,ConstPtr *image)

{
  int iVar1;
  invalid_argument *this_00;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar1 = (((image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  if (iVar1 != 1) {
    if (iVar1 != 3) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Gray or color image expected");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &image->
                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
    core::image::desaturate<unsigned_char>
              ((image *)&local_30,(ConstPtr *)&local_50,DESATURATE_LIGHTNESS);
    std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> *)image,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &image->
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  core::image::integral_image<unsigned_char,long>((image *)&local_30,(ConstPtr *)&local_40);
  std::__shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>,
             &local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void
Surf::set_image (core::ByteImage::ConstPtr image)
{
    /* Desaturate input image. */
    if (image->channels() != 1 && image->channels() != 3)
        throw std::invalid_argument("Gray or color image expected");
    if (image->channels() == 3)
        image = core::image::desaturate<uint8_t>(image,
            core::image::DESATURATE_LIGHTNESS);

    /* Build summed area table (SAT). */
    //util::WallTimer timer;
    this->sat = core::image::integral_image<uint8_t,SatType>(image);
    //std::cout << "Creating SAT image took "
    //    << timer.get_elapsed() << " ms." << std::endl;
}